

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::UnaryOp,_std::default_delete<verilogAST::UnaryOp>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::UnaryOp,_std::default_delete<verilogAST::UnaryOp>_> *node)

{
  pointer pUVar1;
  unique_ptr<verilogAST::UnaryOp,_std::default_delete<verilogAST::UnaryOp>_> *in_RDX;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_30;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_28 [2];
  unique_ptr<verilogAST::UnaryOp,_std::default_delete<verilogAST::UnaryOp>_> *node_local;
  Transformer *this_local;
  
  node_local = node;
  this_local = this;
  pUVar1 = std::unique_ptr<verilogAST::UnaryOp,_std::default_delete<verilogAST::UnaryOp>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_30,&pUVar1->operand);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::UnaryOp,_std::default_delete<verilogAST::UnaryOp>_>.
              _M_t.
              super__Tuple_impl<0UL,_verilogAST::UnaryOp_*,_std::default_delete<verilogAST::UnaryOp>_>
              .super__Head_base<0UL,_verilogAST::UnaryOp_*,_false>._M_head_impl)->super_Expression).
            super_Node)(local_28,node,&local_30);
  pUVar1 = std::unique_ptr<verilogAST::UnaryOp,_std::default_delete<verilogAST::UnaryOp>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            (&pUVar1->operand,local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_30);
  std::unique_ptr<verilogAST::UnaryOp,_std::default_delete<verilogAST::UnaryOp>_>::unique_ptr
            ((unique_ptr<verilogAST::UnaryOp,_std::default_delete<verilogAST::UnaryOp>_> *)this,
             in_RDX);
  return (__uniq_ptr_data<verilogAST::UnaryOp,_std::default_delete<verilogAST::UnaryOp>,_true,_true>
         )(__uniq_ptr_data<verilogAST::UnaryOp,_std::default_delete<verilogAST::UnaryOp>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<UnaryOp> Transformer::visit(std::unique_ptr<UnaryOp> node) {
  node->operand = this->visit(std::move(node->operand));
  return node;
}